

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O2

void changeLibPathsOnFile(string *file_to_fix)

{
  iterator iVar1;
  ostream *poVar2;
  mapped_type *__x;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<Dependency,_std::allocator<Dependency>_> deps_in_file;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::find(&deps_collected_abi_cxx11_._M_t,file_to_fix);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &deps_collected_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::operator<<((ostream *)&std::cout,"    ");
    collectDependencies(file_to_fix);
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  * Fixing dependencies on ");
  poVar2 = std::operator<<(poVar2,(file_to_fix->_M_dataplus)._M_p);
  std::endl<char,std::char_traits<char>>(poVar2);
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
        ::operator[](&deps_per_file_abi_cxx11_,file_to_fix);
  std::vector<Dependency,_std::allocator<Dependency>_>::vector(&deps_in_file,__x);
  uVar3 = ((long)deps_in_file.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)deps_in_file.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x78;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 0x78 - uVar5 != 0; uVar5 = uVar5 + 0x78) {
    Dependency::fixFileThatDependsOnMe
              ((Dependency *)
               ((long)&((deps_in_file.super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                         _M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus._M_p +
               uVar5),file_to_fix);
  }
  std::vector<Dependency,_std::allocator<Dependency>_>::~vector(&deps_in_file);
  return;
}

Assistant:

void changeLibPathsOnFile(std::string file_to_fix)
{
    if (deps_collected.find(file_to_fix) == deps_collected.end())
    {
        std::cout << "    ";
        collectDependencies(file_to_fix);
        std::cout << "\n";
    }
    std::cout << "  * Fixing dependencies on " << file_to_fix.c_str() << std::endl;
    
    std::vector<Dependency> deps_in_file = deps_per_file[file_to_fix];
    const int dep_amount = deps_in_file.size();
    for(int n=0; n<dep_amount; n++)
    {
        deps_in_file[n].fixFileThatDependsOnMe(file_to_fix);
    }
}